

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

QAbstractGraphicsShapeItem * __thiscall
QAbstractGraphicsShapeItem::opaqueArea(QAbstractGraphicsShapeItem *this)

{
  char cVar1;
  long *in_RSI;
  
  cVar1 = QBrush::isOpaque();
  if (cVar1 == '\0') {
    QPainterPath::QPainterPath((QPainterPath *)this);
  }
  else if ((*(uint *)(in_RSI[1] + 0x161) & 0x8000200) == 0) {
    (**(code **)(*in_RSI + 0x20))(this);
  }
  else {
    QGraphicsItem::clipPath(&this->super_QGraphicsItem);
  }
  return this;
}

Assistant:

QPainterPath QAbstractGraphicsShapeItem::opaqueArea() const
{
    Q_D(const QAbstractGraphicsShapeItem);
    if (d->brush.isOpaque())
        return isClipped() ? clipPath() : shape();
    return QGraphicsItem::opaqueArea();
}